

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int selectExpander(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  Expr **ppWhere;
  undefined1 *puVar2;
  char **ppcVar3;
  char cVar4;
  i16 iVar5;
  Parse *pParse;
  sqlite3 *db;
  ExprList *pList;
  SrcList *pList_00;
  sqlite3 *db_00;
  Select *pSVar6;
  ExprList *pEVar7;
  ExprList *pEVar8;
  SrcList *pSVar9;
  Schema *pSVar10;
  Column *pCVar11;
  bool bVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  Table *pTVar16;
  Select *pSVar17;
  Table **ppTVar18;
  Expr *pEVar19;
  SrcList_item *pSVar20;
  char *pcVar21;
  Expr *pEVar22;
  size_t sVar23;
  char *p_00;
  int iVar24;
  uint uVar25;
  With *pWVar26;
  Select *pSVar27;
  ulong uVar28;
  ExprList_item *pEVar29;
  int i_1;
  ExprList *pEList;
  long lVar30;
  char *pcVar31;
  Schema **ppSVar32;
  char *pcVar33;
  Parse *pParse_00;
  int i;
  SrcList *pSVar34;
  long lVar35;
  short sVar36;
  Table **ppTVar37;
  long lVar38;
  ExprList *local_e0;
  With *local_c0;
  long local_a0;
  char *local_98;
  uint local_84;
  long local_68;
  ExprList_item *a;
  Token sColname;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar25 = p->selFlags;
  p->selFlags = uVar25 | 0x40;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  if ((uVar25 & 0x40) != 0) {
    return 1;
  }
  pList = p->pEList;
  pList_00 = p->pSrc;
  pWVar26 = p->pWith;
  if (pWVar26 != (With *)0x0) {
    pWVar26->pOuter = pParse->pWith;
    pParse->pWith = pWVar26;
  }
  sqlite3SrcListAssignCursors(pParse,pList_00);
  iVar14 = pList_00->nSrc;
  if (0 < iVar14) {
    iVar24 = 0;
    pSVar20 = pList_00->a;
    do {
      bVar13 = (pSVar20->fg).field_0x1;
      if ((bVar13 & 0x20) == 0) {
        if (pSVar20->zDatabase == (char *)0x0) {
          pParse_00 = pWalker->pParse;
          pWVar26 = pParse_00->pWith;
          if ((pWVar26 != (With *)0x0) && (pcVar33 = pSVar20->zName, pcVar33 != (char *)0x0)) {
            db_00 = pParse_00->db;
            do {
              iVar14 = pWVar26->nCte;
              if (0 < (long)iVar14) {
                lVar30 = 0;
LAB_00179385:
                pcVar21 = *(char **)((long)&pWVar26->a[0].zName + lVar30);
                iVar15 = sqlite3StrICmp(pcVar33,pcVar21);
                if (iVar15 != 0) goto code_r0x0017939c;
                pcVar31 = *(char **)((long)&pWVar26->a[0].zCteErr + lVar30);
                if (pcVar31 != (char *)0x0) goto LAB_00179999;
                if ((bVar13 & 4) != 0) {
                  pcVar31 = "\'%s\' is not a function";
                  pcVar21 = pcVar33;
                  goto LAB_00179999;
                }
                pTVar16 = (Table *)sqlite3DbMallocZero(db_00,0x80);
                pSVar20->pTab = pTVar16;
                if (pTVar16 == (Table *)0x0) {
                  return 2;
                }
                pTVar16->nTabRef = 1;
                pcVar33 = sqlite3DbStrDup(db_00,*(char **)((long)&pWVar26->a[0].zName + lVar30));
                pTVar16->zName = pcVar33;
                pTVar16->iPKey = -1;
                pTVar16->nRowLogEst = 200;
                *(byte *)&pTVar16->tabFlags = (byte)pTVar16->tabFlags | 0x42;
                pSVar17 = sqlite3SelectDup(db_00,*(Select **)((long)&pWVar26->a[0].pSelect + lVar30)
                                           ,0);
                pSVar20->pSelect = pSVar17;
                if (db_00->mallocFailed != '\0') {
                  return 2;
                }
                bVar13 = pSVar17->op + 0x81;
                if (bVar13 < 2) {
                  pSVar9 = pSVar17->pSrc;
                  iVar14 = pSVar9->nSrc;
                  if (0 < (long)iVar14) {
                    lVar38 = 0;
                    do {
                      if (((*(long *)((long)&pSVar9->a[0].zDatabase + lVar38) == 0) &&
                          (pcVar33 = *(char **)((long)&pSVar9->a[0].zName + lVar38),
                          pcVar33 != (char *)0x0)) &&
                         (iVar15 = sqlite3StrICmp(pcVar33,*(char **)((long)&pWVar26->a[0].zName +
                                                                    lVar30)), iVar15 == 0)) {
                        *(Table **)((long)&pSVar9->a[0].pTab + lVar38) = pTVar16;
                        pbVar1 = &pSVar9->a[0].fg.field_0x1 + lVar38;
                        *pbVar1 = *pbVar1 | 0x20;
                        pTVar16->nTabRef = pTVar16->nTabRef + 1;
                        pbVar1 = (byte *)((long)&pSVar17->selFlags + 1);
                        *pbVar1 = *pbVar1 | 0x20;
                      }
                      lVar38 = lVar38 + 0x70;
                    } while ((long)iVar14 * 0x70 - lVar38 != 0);
                  }
                  if (2 < pTVar16->nTabRef) {
LAB_00179f2c:
                    pcVar31 = "multiple references to recursive table: %s";
                    pcVar21 = *(char **)((long)&pWVar26->a[0].zName + lVar30);
                    goto LAB_00179999;
                  }
                  *(char **)((long)&pWVar26->a[0].zCteErr + lVar30) = "circular reference: %s";
                  local_c0 = pParse_00->pWith;
                  pParse_00->pWith = pWVar26;
                  pSVar6 = pSVar17->pPrior;
                  pSVar6->pWith = pSVar17->pWith;
                  sqlite3WalkSelect(pWalker,pSVar6);
                  pSVar6->pWith = (With *)0x0;
                }
                else {
                  if (2 < pTVar16->nTabRef) goto LAB_00179f2c;
                  *(char **)((long)&pWVar26->a[0].zCteErr + lVar30) = "circular reference: %s";
                  local_c0 = pParse_00->pWith;
                  pParse_00->pWith = pWVar26;
                  sqlite3WalkSelect(pWalker,pSVar17);
                }
                pParse_00->pWith = pWVar26;
                pSVar6 = pSVar17;
                do {
                  pSVar27 = pSVar6;
                  pSVar6 = pSVar27->pPrior;
                } while (pSVar6 != (Select *)0x0);
                pEVar7 = pSVar27->pEList;
                pEVar8 = *(ExprList **)((long)&pWVar26->a[0].pCols + lVar30);
                pEList = pEVar7;
                if (((pEVar8 != (ExprList *)0x0) && (pEList = pEVar8, pEVar7 != (ExprList *)0x0)) &&
                   (pEVar7->nExpr != pEVar8->nExpr)) {
                  sqlite3ErrorMsg(pParse_00,"table %s has %d values for %d columns",
                                  *(undefined8 *)((long)&pWVar26->a[0].zName + lVar30));
                  pParse_00->pWith = local_c0;
                  return 2;
                }
                sqlite3ColumnsFromExprList
                          ((Parse *)pParse_00->db,pEList,&pTVar16->nCol,&pTVar16->aCol);
                if (bVar13 < 2) {
                  pcVar33 = "multiple recursive references: %s";
                  if ((pSVar17->selFlags >> 0xd & 1) == 0) {
                    pcVar33 = "recursive reference in a subquery: %s";
                  }
                  *(char **)((long)&pWVar26->a[0].zCteErr + lVar30) = pcVar33;
                  sqlite3WalkSelect(pWalker,pSVar17);
                }
                *(undefined8 *)((long)&pWVar26->a[0].zCteErr + lVar30) = 0;
                pParse_00->pWith = local_c0;
                break;
              }
LAB_001793a8:
              pWVar26 = pWVar26->pOuter;
            } while (pWVar26 != (With *)0x0);
          }
        }
        if (pSVar20->pTab == (Table *)0x0) {
          if (pSVar20->zName == (char *)0x0) {
            iVar14 = sqlite3WalkSelect(pWalker,pSVar20->pSelect);
            if (iVar14 != 0) {
              return 2;
            }
            iVar14 = sqlite3ExpandSubquery(pParse,pSVar20);
            if (iVar14 != 0) {
              return 2;
            }
          }
          else {
            pTVar16 = sqlite3LocateTableItem(pParse,0,pSVar20);
            pSVar20->pTab = pTVar16;
            if (pTVar16 == (Table *)0x0) {
              return 2;
            }
            if (0xfffe < pTVar16->nTabRef) {
              sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar16->zName);
              pSVar20->pTab = (Table *)0x0;
              return 2;
            }
            pTVar16->nTabRef = pTVar16->nTabRef + 1;
            if (pTVar16->nModuleArg == 0) {
              if (((pSVar20->fg).field_0x1 & 4) != 0) {
                pcVar31 = "\'%s\' is not a function";
                pcVar21 = pSVar20->zName;
                pParse_00 = pParse;
LAB_00179999:
                sqlite3ErrorMsg(pParse_00,pcVar31,pcVar21);
                return 2;
              }
              if (pTVar16->pSelect == (Select *)0x0) goto LAB_001794f7;
            }
            iVar14 = sqlite3ViewGetColumnNames(pParse,pTVar16);
            if (iVar14 != 0) {
              return 2;
            }
            pSVar17 = sqlite3SelectDup(db,pTVar16->pSelect,0);
            pSVar20->pSelect = pSVar17;
            iVar5 = pTVar16->nCol;
            pTVar16->nCol = -1;
            sqlite3WalkSelect(pWalker,pSVar17);
            pTVar16->nCol = iVar5;
          }
        }
LAB_001794f7:
        iVar14 = sqlite3IndexedByLookup(pParse,pSVar20);
        if (iVar14 != 0) {
          return 2;
        }
        iVar14 = pList_00->nSrc;
      }
      iVar24 = iVar24 + 1;
      pSVar20 = pSVar20 + 1;
    } while (iVar24 < iVar14);
  }
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pSVar9 = p->pSrc;
  if (1 < pSVar9->nSrc) {
    pSVar20 = pSVar9->a;
    pSVar34 = pSVar9 + 1;
    ppWhere = &p->pWhere;
    ppTVar18 = &pSVar9->a[0].pTab;
    lVar30 = 0;
    do {
      pTVar16 = (Table *)pSVar34->a[0].zAlias;
      if (pTVar16 != (Table *)0x0 && pSVar20->pTab != (Table *)0x0) {
        bVar13 = (byte)pSVar34->a[0].regReturn;
        uVar25 = (bVar13 & 0x20) >> 5;
        if ((bVar13 & 4) != 0) {
          if ((*(long *)&pSVar34->a[0].iCursor != 0) || (pSVar34->a[0].pOn != (Expr *)0x0)) {
            sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
            return 2;
          }
          sVar36 = pTVar16->nCol;
          if (0 < sVar36) {
            lVar38 = 0;
            do {
              pcVar33 = pTVar16->aCol[lVar38].zName;
              lVar35 = 0;
              ppTVar37 = ppTVar18;
              do {
                iVar14 = columnIndex(*ppTVar37,pcVar33);
                if (-1 < iVar14) {
                  addWhereTerm(pParse,pSVar9,(int)lVar35,iVar14,(int)lVar30 + 1,(int)lVar38,uVar25,
                               ppWhere);
                  sVar36 = pTVar16->nCol;
                  break;
                }
                lVar35 = lVar35 + 1;
                ppTVar37 = ppTVar37 + 0xe;
              } while (lVar30 + 1 != lVar35);
              lVar38 = lVar38 + 1;
            } while (lVar38 < sVar36);
          }
        }
        pEVar19 = *(Expr **)&pSVar34->a[0].iCursor;
        if (pEVar19 != (Expr *)0x0) {
          if (pSVar34->a[0].pOn != (Expr *)0x0) {
            pcVar33 = "cannot have both ON and USING clauses in the same join";
            goto LAB_00179ece;
          }
          if ((bVar13 & 0x20) != 0) {
            setJoinExpr(pEVar19,pSVar34->a[0].regResult);
            pEVar19 = *(Expr **)&pSVar34->a[0].iCursor;
          }
          pEVar19 = sqlite3ExprAnd(pParse->db,*ppWhere,pEVar19);
          *ppWhere = pEVar19;
          *(undefined8 *)&pSVar34->a[0].iCursor = 0;
        }
        pEVar19 = pSVar34->a[0].pOn;
        if ((pEVar19 != (Expr *)0x0) && (0 < (pEVar19->u).iValue)) {
          lVar38 = 0;
          do {
            pcVar21 = *(char **)(*(long *)pEVar19 + lVar38 * 0x10);
            iVar14 = columnIndex(pTVar16,pcVar21);
            if (iVar14 < 0) {
LAB_0017998a:
              pcVar31 = "cannot join using column %s - column not present in both tables";
              pParse_00 = pParse;
              goto LAB_00179999;
            }
            lVar35 = 0;
            ppTVar37 = ppTVar18;
            while (iVar24 = columnIndex(*ppTVar37,pcVar21), iVar24 < 0) {
              lVar35 = lVar35 + 1;
              ppTVar37 = ppTVar37 + 0xe;
              if (lVar30 + 1 == lVar35) goto LAB_0017998a;
            }
            addWhereTerm(pParse,pSVar9,(int)lVar35,iVar24,(int)lVar30 + 1,iVar14,uVar25,ppWhere);
            lVar38 = lVar38 + 1;
          } while (lVar38 < (pEVar19->u).iValue);
        }
      }
      lVar30 = lVar30 + 1;
      pSVar34 = (SrcList *)&pSVar34->a[0].pIBIndex;
      pSVar20 = pSVar20 + 1;
    } while (lVar30 < (long)pSVar9->nSrc + -1);
  }
  if ((long)pList->nExpr < 1) {
    local_84 = 0;
  }
  else {
    lVar30 = 0;
    local_84 = 0;
    do {
      pcVar33 = *(char **)((long)&pList->a[0].pExpr + lVar30);
      cVar4 = *pcVar33;
      if (cVar4 == -0x7a) {
        cVar4 = **(char **)(pcVar33 + 0x18);
      }
      if (cVar4 == -0x54) {
        uVar25 = (uint)pParse->db->flags & 0x44;
        lVar30 = 0;
        local_e0 = (ExprList *)0x0;
        goto LAB_001799d3;
      }
      local_84 = local_84 | *(uint *)(pcVar33 + 4);
      lVar30 = lVar30 + 0x20;
    } while ((long)pList->nExpr * 0x20 != lVar30);
  }
  local_e0 = p->pEList;
  goto LAB_00179eae;
code_r0x0017939c:
  lVar30 = lVar30 + 0x20;
  if ((long)iVar14 * 0x20 == lVar30) goto LAB_001793a8;
  goto LAB_00179385;
LAB_001799d3:
  do {
    pEVar19 = pList->a[lVar30].pExpr;
    local_84 = local_84 | pEVar19->flags;
    if (pEVar19->op == 0xac) {
      pcVar33 = (char *)0x0;
LAB_00179a61:
      iVar14 = pList_00->nSrc;
      if (0 < iVar14) {
        local_a0 = 0;
        local_68 = 0;
        bVar12 = false;
        pSVar20 = pList_00->a;
        do {
          local_98 = pSVar20->zAlias;
          pTVar16 = pSVar20->pTab;
          if (local_98 == (char *)0x0) {
            local_98 = pTVar16->zName;
          }
          if (db->mallocFailed != '\0') break;
          pSVar17 = pSVar20->pSelect;
          if ((pSVar17 == (Select *)0x0) || ((pSVar17->selFlags & 0x800) == 0)) {
            if ((pcVar33 == (char *)0x0) || (iVar24 = sqlite3StrICmp(pcVar33,local_98), iVar24 == 0)
               ) {
              if (pTVar16->pSchema == (Schema *)0x0) {
                pSVar17 = (Select *)0x0;
                pcVar21 = "*";
              }
              else {
                uVar28 = 0xffffffffffffffff;
                ppSVar32 = &db->aDb->pSchema;
                do {
                  uVar28 = uVar28 + 1;
                  pSVar10 = *ppSVar32;
                  ppSVar32 = ppSVar32 + 4;
                } while (pSVar10 != pTVar16->pSchema);
                pcVar21 = db->aDb[uVar28 & 0xffffffff].zDbSName;
                pSVar17 = (Select *)0x0;
              }
              goto LAB_00179b2e;
            }
          }
          else {
            pcVar21 = (char *)0x0;
LAB_00179b2e:
            if (0 < pTVar16->nCol) {
              lVar38 = 0;
              do {
                pCVar11 = pTVar16->aCol;
                pcVar31 = pCVar11[lVar38].zName;
                if (((pSVar17 == (Select *)0x0 || pcVar33 == (char *)0x0) ||
                    (iVar14 = sqlite3MatchSpanName
                                        (pSVar17->pEList->a[lVar38].zSpan,(char *)0x0,pcVar33,
                                         (char *)0x0), iVar14 != 0)) &&
                   (((p->selFlags & 0x20000) != 0 || ((pCVar11[lVar38].colFlags & 2) == 0)))) {
                  if (local_68 != 0 && pcVar33 == (char *)0x0) {
                    if (((pSVar20->fg).jointype & 4) != 0) {
                      lVar35 = 0;
                      do {
                        iVar14 = columnIndex(*(Table **)((long)&pList_00->a[0].pTab + lVar35),
                                             pcVar31);
                        if (-1 < iVar14) {
                          bVar12 = true;
                          goto LAB_00179de0;
                        }
                        lVar35 = lVar35 + 0x70;
                      } while (local_a0 != lVar35);
                    }
                    iVar14 = sqlite3IdListIndex(pSVar20->pUsing,pcVar31);
                    bVar12 = true;
                    if (-1 < iVar14) goto LAB_00179de0;
                  }
                  pEVar19 = sqlite3Expr(db,0x3b,pcVar31);
                  if ((uVar25 == 4) || (1 < pList_00->nSrc)) {
                    pEVar22 = sqlite3Expr(db,0x3b,local_98);
                    pEVar19 = sqlite3PExpr(pParse,0x86,pEVar22,pEVar19);
                    if (pcVar21 != (char *)0x0) {
                      sColname.z = pcVar21;
                      sVar23 = strlen(pcVar21);
                      sColname.n = (uint)sVar23 & 0x3fffffff;
                      pEVar22 = sqlite3ExprAlloc(db,0x3b,&sColname,0);
                      pEVar19 = sqlite3PExpr(pParse,0x86,pEVar22,pEVar19);
                    }
                    if (uVar25 != 4) goto LAB_00179cf8;
                    p_00 = sqlite3MPrintf(db,"%s.%s",local_98);
                    pcVar31 = p_00;
                  }
                  else {
LAB_00179cf8:
                    p_00 = (char *)0x0;
                  }
                  local_e0 = sqlite3ExprListAppend((Parse *)pParse->db,local_e0,pEVar19);
                  sColname.z = pcVar31;
                  if (pcVar31 == (char *)0x0) {
                    sColname.n = 0;
                  }
                  else {
                    sVar23 = strlen(pcVar31);
                    sColname.n = (uint)sVar23 & 0x3fffffff;
                  }
                  sqlite3ExprListSetName(pParse,local_e0,&sColname,0);
                  if ((local_e0 != (ExprList *)0x0) && ((p->selFlags & 0x800) != 0)) {
                    iVar14 = local_e0->nExpr;
                    if (pSVar17 == (Select *)0x0) {
                      pcVar31 = sqlite3MPrintf(db,"%s.%s.%s",pcVar21,local_98,pcVar31);
                    }
                    else {
                      pcVar31 = sqlite3DbStrDup(db,pSVar17->pEList->a[lVar38].zSpan);
                    }
                    local_e0->a[(long)iVar14 + -1].zSpan = pcVar31;
                    puVar2 = &local_e0->a[(long)iVar14 + -1].field_0x19;
                    *puVar2 = *puVar2 | 2;
                  }
                  bVar12 = true;
                  if (p_00 != (char *)0x0) {
                    sqlite3DbFreeNN(db,p_00);
                  }
                }
LAB_00179de0:
                lVar38 = lVar38 + 1;
              } while (lVar38 < pTVar16->nCol);
              iVar14 = pList_00->nSrc;
            }
          }
          local_68 = local_68 + 1;
          pSVar20 = pSVar20 + 1;
          local_a0 = local_a0 + 0x70;
        } while (local_68 < iVar14);
        if (bVar12) goto LAB_00179e80;
      }
      if (pcVar33 == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"no tables specified");
      }
      else {
        sqlite3ErrorMsg(pParse,"no such table: %s",pcVar33);
      }
    }
    else {
      if ((pEVar19->op == 0x86) && (pEVar19->pRight->op == 0xac)) {
        pcVar33 = (pEVar19->pLeft->u).zToken;
        goto LAB_00179a61;
      }
      pEVar29 = pList->a + lVar30;
      local_e0 = sqlite3ExprListAppend((Parse *)pParse->db,local_e0,pEVar19);
      if (local_e0 != (ExprList *)0x0) {
        pcVar33 = pEVar29->zSpan;
        ppcVar3 = &local_e0->a[(long)local_e0->nExpr + -1].zName;
        *ppcVar3 = pEVar29->zName;
        ppcVar3[1] = pcVar33;
        pEVar29->zName = (char *)0x0;
        pEVar29->zSpan = (char *)0x0;
      }
      pEVar29->pExpr = (Expr *)0x0;
    }
LAB_00179e80:
    lVar30 = lVar30 + 1;
  } while (lVar30 < pList->nExpr);
  exprListDeleteNN(db,pList);
  p->pEList = local_e0;
LAB_00179eae:
  if (local_e0 == (ExprList *)0x0) {
    return 0;
  }
  if (local_e0->nExpr <= db->aLimit[2]) {
    if ((local_84 & 0x200004) != 0) {
      pbVar1 = (byte *)((long)&p->selFlags + 2);
      *pbVar1 = *pbVar1 | 4;
      return 0;
    }
    return 0;
  }
  pcVar33 = "too many columns in result set";
LAB_00179ece:
  sqlite3ErrorMsg(pParse,pcVar33);
  return 2;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;
  u32 elistFlags = 0;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  assert( p->pSrc!=0 );
  if( (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  sqlite3WithPush(pParse, p->pWith, 0);

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->fg.isRecursive ) continue;
    assert( pFrom->pTab==0 );
#ifndef SQLITE_OMIT_CTE
    if( withExpand(pWalker, pFrom) ) return WRC_Abort;
    if( pFrom->pTab ) {} else
#endif
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      if( sqlite3ExpandSubquery(pParse, pFrom) ) return WRC_Abort;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( IsVirtual(pTab) || pTab->pSelect ){
        i16 nCol;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        nCol = pTab->nCol;
        pTab->nCol = -1;
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
    elistFlags |= pE->flags;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      elistFlags |= pE->flags;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j]) 
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->fg.jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sqlite3TokenInit(&sColname, zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
  if( p->pEList ){
    if( p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
      sqlite3ErrorMsg(pParse, "too many columns in result set");
      return WRC_Abort;
    }
    if( (elistFlags & (EP_HasFunc|EP_Subquery))!=0 ){
      p->selFlags |= SF_ComplexResult;
    }
  }
  return WRC_Continue;
}